

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

void bson_iter_timestamp(bson_iter_t *iter,uint32_t *timestamp,uint32_t *increment)

{
  undefined8 uVar1;
  uint32_t uVar2;
  
  if (iter != (bson_iter_t *)0x0) {
    uVar2 = 0;
    uVar1 = 0;
    if (iter->raw[iter->type] == '\x11') {
      uVar1 = *(undefined8 *)(iter->raw + iter->d1);
      uVar2 = (uint32_t)((ulong)uVar1 >> 0x20);
    }
    if (timestamp != (uint32_t *)0x0) {
      *timestamp = uVar2;
    }
    if (increment != (uint32_t *)0x0) {
      *increment = (uint32_t)uVar1;
    }
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x66d,"bson_iter_timestamp","iter");
  abort();
}

Assistant:

void
bson_iter_timestamp (const bson_iter_t *iter, /* IN */
                     uint32_t *timestamp,     /* OUT */
                     uint32_t *increment)     /* OUT */
{
   uint64_t encoded;
   uint32_t ret_timestamp = 0;
   uint32_t ret_increment = 0;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_TIMESTAMP) {
      memcpy (&encoded, iter->raw + iter->d1, sizeof (encoded));
      encoded = BSON_UINT64_FROM_LE (encoded);
      ret_timestamp = (encoded >> 32) & 0xFFFFFFFF;
      ret_increment = encoded & 0xFFFFFFFF;
   }

   if (timestamp) {
      *timestamp = ret_timestamp;
   }

   if (increment) {
      *increment = ret_increment;
   }
}